

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O3

int genquad(optype intopcode,addressrec a,addressrec b,addressrec c)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)numcodes;
  intcode[lVar2].opcode = intopcode;
  intcode[lVar2].op1.opndtype = a.opndtype;
  intcode[lVar2].op1.opnd = a.opnd;
  intcode[lVar2].op2 = b;
  iVar1 = numcodes;
  numcodes = numcodes + 1;
  intcode[lVar2].op3 = c;
  return iVar1;
}

Assistant:

int	genquad(enum optype intopcode, struct addressrec a,
            struct addressrec b, struct addressrec c)
{
    intcode[numcodes].opcode = intopcode;
    intcode[numcodes].op1.opndtype = a.opndtype;
    intcode[numcodes].op1.opnd = a.opnd;
    intcode[numcodes].op2 = b;
    intcode[numcodes++].op3 = c;
    return(numcodes-1);
}